

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Kernel * anon_unknown.dwarf_149389::LeafKernel::create
                   (string *def,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  pointer pbVar1;
  pointer pbVar2;
  Kernel *pKVar3;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pKVar3 = (Kernel *)operator_new(0x60);
  pKVar3->_vptr_Kernel = (_func_int **)&PTR_process_0028fb20;
  if (pbVar1 == pbVar2) {
    *(undefined1 *)&pKVar3[1]._vptr_Kernel = 1;
    std::__cxx11::string::string((string *)(pKVar3 + 2),(string *)def);
    pKVar3[6]._vptr_Kernel = (_func_int **)0x0;
    pKVar3[7]._vptr_Kernel = (_func_int **)(pKVar3 + 9);
    pKVar3[8]._vptr_Kernel = (_func_int **)0x0;
    *(undefined1 *)&pKVar3[9]._vptr_Kernel = 0;
  }
  else {
    *(undefined1 *)&pKVar3[1]._vptr_Kernel = 0;
    std::__cxx11::string::string((string *)(pKVar3 + 2),(string *)def);
    pKVar3[6]._vptr_Kernel = (_func_int **)0x0;
    std::__cxx11::string::string((string *)(pKVar3 + 7),(string *)pbVar1);
  }
  pKVar3[0xb]._vptr_Kernel = (_func_int **)0x0;
  return pKVar3;
}

Assistant:

static Kernel* create(const std::string& def, const std::vector<std::string>& args)
    {
        if (args.empty())
            return new LeafKernel(def);

        return new LeafKernel(def, args.front());
    }